

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O0

bool fs_is_absolute(string_view path)

{
  bool bVar1;
  path local_48;
  undefined1 local_20 [8];
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  local_20 = (undefined1  [8])path._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  if (bVar1) {
    path_local._M_str._7_1_ = 0;
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_48,(basic_string_view<char,_std::char_traits<char>_> *)local_20,auto_format);
    path_local._M_str._7_1_ = std::filesystem::__cxx11::path::is_absolute(&local_48);
    std::filesystem::__cxx11::path::~path(&local_48);
  }
  return (bool)(path_local._M_str._7_1_ & 1);
}

Assistant:

bool fs_is_absolute(std::string_view path)
{
  if(path.empty())
    return false;

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).is_absolute();
#else
  if(fs_is_windows())
    return path.length() > 2 && !(fs_root_name(path).empty()) && (path[2] == '/' || path[2] == '\\');
  else
    return path.front() == '/';
#endif
}